

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O3

bool __thiscall pbrt::Image::Write(Image *this,string *name,ImageMetadata *metadata)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  bool bVar2;
  int iVar3;
  memory_resource *pmVar4;
  Allocator AVar5;
  PixelFormat PVar6;
  ImageMetadata *extraout_RDX;
  ImageMetadata *extraout_RDX_00;
  ImageMetadata *extraout_RDX_01;
  ImageMetadata *extraout_RDX_02;
  ImageMetadata *pIVar7;
  Half *pHVar8;
  long *plVar9;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  this_00;
  Image *this_01;
  long lVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels_01;
  int vb;
  int iStack_21c;
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  *local_200 [2];
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_1f0;
  undefined1 local_1e8 [8];
  long *local_1e0 [2];
  long local_1d0;
  undefined1 local_1c8 [8];
  Half *local_1c0 [2];
  Half local_1b0 [4];
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_1a8;
  Image rgbImage;
  ImageChannelDesc desc_1;
  undefined1 local_c0 [16];
  long *local_b0 [2];
  long local_a0 [2];
  ImageChannelDesc desc;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> local_60;
  
  if ((metadata->pixelBounds).set == true) {
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *(ulong *)((long)&(metadata->pixelBounds).optionalValue + 8);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = *(ulong *)&(metadata->pixelBounds).optionalValue;
    auVar12 = vpsubd_avx(auVar11,auVar12);
    auVar11 = vpshufd_avx(auVar12,0x55);
    auVar11 = vpmulld_avx(auVar11,auVar12);
    rgbImage.format = auVar11._0_4_;
    PVar6 = (this->resolution).super_Tuple2<pbrt::Point2,_int>.y *
            (this->resolution).super_Tuple2<pbrt::Point2,_int>.x;
    vb = PVar6;
    if (auVar11._0_4_ != PVar6) {
      LogFatal<char_const(&)[29],char_const(&)[28],char_const(&)[29],int&,char_const(&)[28],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/image.cpp"
                 ,0x378,"Check failed: %s == %s with %s = %s, %s = %s",
                 (char (*) [29])"metadata.pixelBounds->Area()",
                 (char (*) [28])"resolution.x * resolution.y",
                 (char (*) [29])"metadata.pixelBounds->Area()",(int *)&rgbImage,
                 (char (*) [28])"resolution.x * resolution.y",&vb);
    }
  }
  pvVar1 = &rgbImage.channelNames;
  rgbImage._0_8_ = pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rgbImage,"exr","");
  bVar2 = HasExtension(name,(string *)&rgbImage);
  if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)rgbImage._0_8_ != pvVar1) {
    operator_delete((void *)rgbImage._0_8_,
                    (ulong)((long)&(rgbImage.channelNames.alloc.memoryResource)->
                                   _vptr_memory_resource + 1));
  }
  if (bVar2) {
    bVar2 = WriteEXR(this,name,metadata);
    return bVar2;
  }
  iVar3 = (int)(this->channelNames).nStored;
  if (4 < iVar3) {
    rgbImage.resolution.super_Tuple2<pbrt::Point2,_int>.y = 0;
    rgbImage._12_4_ = 0;
    vb = iVar3;
    rgbImage.channelNames.alloc.memoryResource =
         (memory_resource *)((ulong)rgbImage.channelNames.alloc.memoryResource & 0xffffffffffffff00)
    ;
    rgbImage._0_8_ = pvVar1;
    detail::stringPrintfRecursive<std::__cxx11::string&,int>
              ((string *)&rgbImage,"%s: unable to write an %d channel image in this format.",name,
               &vb);
    Error((FileLoc *)0x0,(char *)rgbImage._0_8_);
    if ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)rgbImage._0_8_ != pvVar1) {
      operator_delete((void *)rgbImage._0_8_,
                      (ulong)((long)&(rgbImage.channelNames.alloc.memoryResource)->
                                     _vptr_memory_resource + 1));
    }
    return false;
  }
  pmVar4 = pstd::pmr::new_delete_resource();
  rgbImage.format = U256;
  rgbImage.resolution.super_Tuple2<pbrt::Point2,_int>.x = 0;
  rgbImage._8_8_ = (ulong)(uint)rgbImage._12_4_ << 0x20;
  rgbImage.channelNames.alloc.memoryResource = pstd::pmr::new_delete_resource();
  rgbImage.channelNames.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  rgbImage.channelNames.nAlloc = 0;
  rgbImage.channelNames.nStored = 0;
  rgbImage.encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  rgbImage.p8.nStored = 0;
  rgbImage.p8.ptr = (uchar *)0x0;
  rgbImage.p8.nAlloc = 0;
  rgbImage.p16.ptr = (Half *)0x0;
  rgbImage.p16.nAlloc = 0;
  rgbImage.p16.nStored = 0;
  rgbImage.p32.nStored = 0;
  rgbImage.p32.ptr = (float *)0x0;
  rgbImage.p32.nAlloc = 0;
  iVar3 = (int)(this->channelNames).nStored;
  this_01 = this;
  rgbImage.p8.alloc.memoryResource = pmVar4;
  rgbImage.p16.alloc.memoryResource = pmVar4;
  rgbImage.p32.alloc.memoryResource = pmVar4;
  if (iVar3 == 4) {
    _vb = (pointer)&local_210;
    std::__cxx11::string::_M_construct<char_const*>((string *)&vb,"R","");
    local_200[0] = &local_1f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"G","");
    local_1e0[0] = &local_1d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"B","");
    pHVar8 = local_1b0;
    local_1c0[0] = pHVar8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"A","");
    requestedChannels.n = 4;
    requestedChannels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb
    ;
    GetChannelDesc(&desc,this,requestedChannels);
    lVar10 = -0x80;
    do {
      if (pHVar8 != *(Half **)(pHVar8 + -8)) {
        operator_delete(*(Half **)(pHVar8 + -8),*(long *)pHVar8 + 1);
      }
      pHVar8 = pHVar8 + -0x10;
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0);
    if (desc.offset.nStored != 0) {
      desc_1.offset.alloc.memoryResource = (memory_resource *)&desc_1.offset.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&desc_1,"R","");
      desc_1.offset.nAlloc = (size_t)local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&desc_1.offset.nAlloc,"G","");
      plVar9 = local_a0;
      local_b0[0] = plVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"B","");
      requestedChannels_00.n = 3;
      requestedChannels_00.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&desc_1;
      GetChannelDesc((ImageChannelDesc *)&local_60,this,requestedChannels_00);
      AVar5.memoryResource = pstd::pmr::new_delete_resource();
      SelectChannels((Image *)&vb,this,(ImageChannelDesc *)&local_60,AVar5);
      rgbImage.resolution.super_Tuple2<pbrt::Point2,_int>.y = (int)local_218;
      rgbImage._0_8_ = _vb;
      pstd::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&rgbImage.channelNames,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_210);
      rgbImage.encoding.
      super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
      .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
               )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )local_1f0.bits;
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                (&rgbImage.p8,
                 (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                 local_1e8);
      pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                (&rgbImage.p16,
                 (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_1c8);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                (&rgbImage.p32,&local_1a8);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_1a8);
      pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
                ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_1c8);
      pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                 local_1e8);
      pstd::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_210);
      InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&local_60);
      lVar10 = -0x60;
      do {
        if (plVar9 != (long *)plVar9[-2]) {
          operator_delete((long *)plVar9[-2],*plVar9 + 1);
        }
        plVar9 = plVar9 + -4;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0);
      InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&desc.offset);
      iVar3 = (int)(this->channelNames).nStored;
      this_01 = &rgbImage;
      goto LAB_00438106;
    }
    local_218 = 0;
    local_210._M_local_buf[0] = '\0';
    _vb = (pointer)&local_210;
    detail::stringPrintfRecursive<std::__cxx11::string&>
              ((string *)&vb,"%s: unable to write an 4 channel image that is not RGBA.",name);
    Error((FileLoc *)0x0,_vb);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_vb != &local_210) {
      operator_delete(_vb,CONCAT71(local_210._M_allocated_capacity._1_7_,local_210._M_local_buf[0])
                          + 1);
    }
    InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&desc.offset);
  }
  else {
LAB_00438106:
    if (iVar3 == 3) {
      this_00 = (metadata->colorSpace).optionalValue;
      if (this_00 ==
          (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
           )0x0) {
        this_00 = RGBColorSpace::sRGB;
      }
      if ((metadata->colorSpace).set == false) {
        this_00 = RGBColorSpace::sRGB;
      }
      bVar2 = RGBColorSpace::operator!=
                        ((RGBColorSpace *)this_00,(RGBColorSpace *)RGBColorSpace::sRGB);
      if (bVar2) {
        local_218 = 0;
        local_210._M_local_buf[0] = '\0';
        _vb = (pointer)&local_210;
        detail::stringPrintfRecursive<std::__cxx11::string&>
                  ((string *)&vb,
                   "%s: writing image with non-sRGB color space to a format that doesn\'t store color spaces."
                   ,name);
        Warning((FileLoc *)0x0,_vb);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_vb != &local_210) {
          operator_delete(_vb,CONCAT71(local_210._M_allocated_capacity._1_7_,
                                       local_210._M_local_buf[0]) + 1);
        }
      }
    }
    if ((int)(this->channelNames).nStored == 3) {
      _vb = (pointer)&local_210;
      std::__cxx11::string::_M_construct<char_const*>((string *)&vb,"R","");
      local_200[0] = &local_1f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"G","");
      plVar9 = &local_1d0;
      local_1e0[0] = plVar9;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1e0,"B","");
      requestedChannels_01.n = 3;
      requestedChannels_01.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb;
      GetChannelDesc(&desc_1,this,requestedChannels_01);
      lVar10 = -0x60;
      do {
        if (plVar9 != (long *)plVar9[-2]) {
          operator_delete((long *)plVar9[-2],*plVar9 + 1);
        }
        plVar9 = plVar9 + -4;
        lVar10 = lVar10 + 0x20;
      } while (lVar10 != 0);
      if (desc_1.offset.nStored == 0) {
        local_218 = 0;
        local_210._M_local_buf[0] = '\0';
        _vb = (pointer)&local_210;
        detail::stringPrintfRecursive<std::__cxx11::string&>
                  ((string *)&vb,
                   "%s: 3-channels but doesn\'t have R, G, and B. Image may be garbled.",name);
        Warning((FileLoc *)0x0,_vb);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_vb != &local_210) {
          operator_delete(_vb,CONCAT71(local_210._M_allocated_capacity._1_7_,
                                       local_210._M_local_buf[0]) + 1);
        }
      }
      else {
        AVar5.memoryResource = pstd::pmr::new_delete_resource();
        SelectChannels((Image *)&vb,this,&desc_1,AVar5);
        rgbImage.resolution.super_Tuple2<pbrt::Point2,_int>.y = (int)local_218;
        rgbImage._0_8_ = _vb;
        pstd::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&rgbImage.channelNames,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_210);
        rgbImage.encoding.
        super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
        .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )(TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                   )local_1f0.bits;
        pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::operator=
                  (&rgbImage.p8,
                   (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                   local_1e8);
        pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::operator=
                  (&rgbImage.p16,
                   (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_1c8);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=
                  (&rgbImage.p32,&local_1a8);
        pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_1a8);
        pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
                  ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_1c8);
        pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                   local_1e8);
        pstd::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_210);
        this_01 = &rgbImage;
      }
      InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector(&desc_1.offset);
    }
    _vb = (pointer)&local_210;
    std::__cxx11::string::_M_construct<char_const*>((string *)&vb,"pfm","");
    bVar2 = HasExtension(name,(string *)&vb);
    pIVar7 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_vb != &local_210) {
      operator_delete(_vb,CONCAT71(local_210._M_allocated_capacity._1_7_,local_210._M_local_buf[0])
                          + 1);
      pIVar7 = extraout_RDX_00;
    }
    if (bVar2) {
      bVar2 = WritePFM(this_01,name,pIVar7);
      goto LAB_004384c9;
    }
    _vb = (pointer)&local_210;
    std::__cxx11::string::_M_construct<char_const*>((string *)&vb,"png","");
    bVar2 = HasExtension(name,(string *)&vb);
    pIVar7 = extraout_RDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_vb != &local_210) {
      operator_delete(_vb,CONCAT71(local_210._M_allocated_capacity._1_7_,local_210._M_local_buf[0])
                          + 1);
      pIVar7 = extraout_RDX_02;
    }
    if (bVar2) {
      bVar2 = WritePNG(this_01,name,pIVar7);
      goto LAB_004384c9;
    }
    local_218 = 0;
    local_210._M_local_buf[0] = '\0';
    _vb = (pointer)&local_210;
    detail::stringPrintfRecursive<std::__cxx11::string&>
              ((string *)&vb,"%s: no support for writing images with this extension",name);
    Error((FileLoc *)0x0,_vb);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_vb != &local_210) {
      operator_delete(_vb,CONCAT71(local_210._M_allocated_capacity._1_7_,local_210._M_local_buf[0])
                          + 1);
    }
  }
  bVar2 = false;
LAB_004384c9:
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&rgbImage.p32);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector(&rgbImage.p16);
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
            (&rgbImage.p8);
  pstd::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&rgbImage.channelNames);
  return bVar2;
}

Assistant:

bool Image::Write(std::string name, const ImageMetadata &metadata) const {
    if (metadata.pixelBounds)
        CHECK_EQ(metadata.pixelBounds->Area(), resolution.x * resolution.y);

    if (HasExtension(name, "exr"))
        return WriteEXR(name, metadata);

    if (NChannels() > 4) {
        Error("%s: unable to write an %d channel image in this format.", name,
              NChannels());
        return false;
    }

    const Image *image = this;
    Image rgbImage;
    if (NChannels() == 4) {
        ImageChannelDesc desc = GetChannelDesc({"R", "G", "B", "A"});
        if (desc) {
            rgbImage = SelectChannels(GetChannelDesc({"R", "G", "B"}));
            image = &rgbImage;
        } else {
            Error("%s: unable to write an 4 channel image that is not RGBA.", name);
            return false;
        }
    }
    if (NChannels() == 3 && *metadata.GetColorSpace() != *RGBColorSpace::sRGB)
        Warning("%s: writing image with non-sRGB color space to a format that "
                "doesn't store color spaces.",
                name);

    if (NChannels() == 3) {
        // Order as RGB
        ImageChannelDesc desc = GetChannelDesc({"R", "G", "B"});
        if (!desc)
            Warning("%s: 3-channels but doesn't have R, G, and B. "
                    "Image may be garbled.",
                    name);
        else {
            rgbImage = SelectChannels(desc);
            image = &rgbImage;
        }
    }

    if (HasExtension(name, "pfm"))
        return image->WritePFM(name, metadata);
    else if (HasExtension(name, "png"))
        return image->WritePNG(name, metadata);
    else {
        Error("%s: no support for writing images with this extension", name);
        return false;
    }
}